

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O0

void __thiscall
embree::TutorialApplication::compareToReferenceImage(TutorialApplication *this,FileName *fileName)

{
  Ref<embree::Image> *pRVar1;
  Ref<embree::Image> *image1;
  runtime_error *this_00;
  string *name;
  Ref<embree::Image> *image0;
  long *in_RDI;
  double dVar2;
  double error;
  Ref<embree::Image> reference;
  Ref<embree::Image> image;
  uint i;
  ISPCCamera ispccamera;
  uint in_stack_fffffffffffffdf8;
  uint in_stack_fffffffffffffdfc;
  TutorialApplication *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  undefined1 copy;
  Col4<unsigned_char> *color;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  ImageT<embree::Col4<unsigned_char>_> *in_stack_fffffffffffffea8;
  string local_138 [31];
  undefined1 in_stack_fffffffffffffee7;
  FileName *in_stack_fffffffffffffee8;
  long *plVar3;
  long *local_100;
  Col4<unsigned_char> local_e1 [8];
  Ref<embree::Image> *local_c0;
  uint local_b8;
  undefined1 local_b4 [28];
  size_t in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  Camera *in_stack_ffffffffffffff78;
  
  resize(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8);
  Camera::getISPCCamera
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  initRayStats(in_stack_fffffffffffffe00);
  for (local_b8 = 0; local_b8 < *(uint *)((long)in_RDI + 0x174); local_b8 = local_b8 + 1) {
    (**(code **)(*in_RDI + 0x58))
              (*(undefined4 *)((long)in_RDI + 0x1c4),in_RDI,in_RDI[0x25],(int)in_RDI[0x24],
               *(undefined4 *)((long)in_RDI + 0x124),local_b4);
  }
  image1 = (Ref<embree::Image> *)::operator_new(0x48);
  image0 = (Ref<embree::Image> *)(ulong)*(uint *)(in_RDI + 0x24);
  name = (string *)(ulong)*(uint *)((long)in_RDI + 0x124);
  copy = (undefined1)((ulong)in_RDI[0x25] >> 0x38);
  color = local_e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e1[0].g,"",(allocator *)color);
  ImageT<embree::Col4<unsigned_char>_>::ImageT
            (in_stack_fffffffffffffea8,CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0)
             ,(size_t)in_RDI,color,(bool)copy,name,SUB81((ulong)image0 >> 0x38,0));
  local_c0 = image1;
  if (image1 != (Ref<embree::Image> *)0x0) {
    (*(code *)image1->ptr->width)();
  }
  std::__cxx11::string::~string((string *)&local_e1[0].g);
  std::allocator<char>::~allocator((allocator<char> *)local_e1);
  loadImage(in_stack_fffffffffffffee8,(bool)in_stack_fffffffffffffee7);
  pRVar1 = local_c0;
  if (local_c0 != (Ref<embree::Image> *)0x0) {
    (*(code *)local_c0->ptr->width)();
  }
  plVar3 = local_100;
  if (local_100 != (long *)0x0) {
    (**(code **)(*local_100 + 0x10))();
  }
  dVar2 = compareImages(image0,image1);
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 0x18))();
  }
  if (pRVar1 != (Ref<embree::Image> *)0x0) {
    (*(code *)pRVar1->ptr->height)();
  }
  if ((double)*(float *)(in_RDI + 0x2e) < dVar2) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string((double)in_stack_fffffffffffffe08);
    std::operator+(in_stack_fffffffffffffe08,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe00);
    std::runtime_error::runtime_error(this_00,local_138);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_100 != (long *)0x0) {
    (**(code **)(*local_100 + 0x18))();
  }
  if (local_c0 != (Ref<embree::Image> *)0x0) {
    (*(code *)local_c0->ptr->height)();
  }
  return;
}

Assistant:

void TutorialApplication::compareToReferenceImage(const FileName& fileName)
  {
    resize(width,height);
    ISPCCamera ispccamera = camera.getISPCCamera(width,height);
    initRayStats();
    
    for (unsigned int i=0; i<numFrames; i++)
      render(pixels,width,height,render_time,ispccamera);

    Ref<Image> image = new Image4uc(width, height, (Col4uc*)pixels);
    Ref<Image> reference = loadImage(fileName);
    const double error = compareImages(image,reference);
    if (error > referenceImageThreshold) // error corresponds roughly to number of pixels that are completely off in color
      throw std::runtime_error("reference image differs by " + std::to_string(error));
  }